

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparcDisassembler.c
# Opt level: O3

_Bool Sparc_getInstruction
                (csh ud,uint8_t *code,size_t code_len,MCInst *MI,uint16_t *size,uint64_t address,
                void *info)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  cs_detail *__s;
  long lVar6;
  uint8_t *puVar7;
  uint uVar8;
  DecodeStatus DVar9;
  uint8_t *orig_p;
  ulong uVar10;
  uint *puVar11;
  byte bVar12;
  void *Decoder;
  ulong uVar13;
  uint64_t Address;
  uint Reg;
  uint uVar14;
  uint uVar15;
  uint8_t *puVar16;
  byte *pbVar17;
  code *pcVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  int iVar23;
  uint local_48;
  
  if (code_len < 4) {
    return false;
  }
  bVar1 = *code;
  bVar2 = code[1];
  bVar3 = code[2];
  bVar4 = code[3];
  uVar8 = (uint)bVar3 << 8;
  uVar21 = (uint)bVar2 << 0x10;
  uVar22 = uVar21 | uVar8;
  __s = MI->flat_insn->detail;
  if (__s != (cs_detail *)0x0) {
    memset(__s,0,0x5f8);
  }
  local_48 = (uint)bVar4;
  uVar14 = (uint)bVar1 << 0x18 | uVar22 | local_48;
  uVar15 = 0;
  puVar7 = DecoderTableSparc32;
  do {
    puVar16 = puVar7;
    switch(*puVar16) {
    case '\x01':
      uVar15 = ~(-1 << (puVar16[2] & 0x1f)) << (puVar16[1] & 0x1f);
      if (puVar16[2] == 0x20) {
        uVar15 = 0xffffffff;
      }
      uVar15 = (uVar15 & uVar14) >> (puVar16[1] & 0x1f);
      puVar7 = puVar16 + 3;
      break;
    case '\x02':
      uVar10 = 0;
      uVar19 = 0;
      bVar12 = 0;
      do {
        lVar6 = uVar10 + 1;
        uVar19 = uVar19 + ((puVar16[lVar6] & 0x7f) << (bVar12 & 0x1f));
        bVar12 = bVar12 + 7;
        uVar10 = uVar10 + 1;
      } while ((char)puVar16[lVar6] < '\0');
      puVar7 = puVar16 + (uVar10 & 0xffffffff) + 3;
      if (uVar15 != uVar19) {
        puVar7 = puVar16 + (uVar10 & 0xffffffff) + 3 +
                 *(ushort *)(puVar16 + (uVar10 & 0xffffffff) + 1);
      }
      break;
    case '\x03':
      uVar19 = ~(-1 << (puVar16[2] & 0x1f)) << (puVar16[1] & 0x1f);
      if (puVar16[2] == 0x20) {
        uVar19 = 0xffffffff;
      }
      uVar10 = 0;
      uVar20 = 0;
      bVar12 = 0;
      do {
        lVar6 = uVar10 + 3;
        uVar20 = uVar20 + ((puVar16[lVar6] & 0x7f) << (bVar12 & 0x1f));
        bVar12 = bVar12 + 7;
        uVar10 = uVar10 + 1;
      } while ((char)puVar16[lVar6] < '\0');
      puVar7 = puVar16 + (uVar10 & 0xffffffff) + 5;
      if ((uVar19 & uVar14) >> (puVar16[1] & 0x1f) != uVar20) {
        puVar7 = puVar16 + (uVar10 & 0xffffffff) + 5 +
                 *(ushort *)(puVar16 + (uVar10 & 0xffffffff) + 3);
      }
      break;
    case '\x04':
      uVar10 = 0;
      do {
        lVar6 = uVar10 + 1;
        uVar10 = uVar10 + 1;
      } while ((char)puVar16[lVar6] < '\0');
      puVar7 = puVar16 + (uVar10 & 0xffffffff) + 3;
      break;
    case '\x05':
      goto switchD_001a4195_caseD_5;
    case '\x06':
      uVar10 = 0;
      do {
        lVar6 = uVar10 + 1;
        uVar10 = uVar10 + 1;
      } while ((char)puVar16[lVar6] < '\0');
      uVar13 = 0;
      do {
        lVar6 = uVar13 + (uVar10 & 0xffffffff) + 1;
        uVar13 = uVar13 + 1;
      } while ((char)puVar16[lVar6] < '\0');
      puVar7 = puVar16 + (uVar13 & 0xffffffff) + (uVar10 & 0xffffffff) + 1;
      break;
    default:
      return false;
    }
  } while( true );
switchD_001a4195_caseD_5:
  uVar10 = 0;
  uVar15 = 0;
  bVar12 = 0;
  do {
    lVar6 = uVar10 + 1;
    uVar15 = uVar15 + ((puVar16[lVar6] & 0x7f) << (bVar12 & 0x1f));
    bVar12 = bVar12 + 7;
    uVar10 = uVar10 + 1;
  } while ((char)puVar16[lVar6] < '\0');
  pbVar17 = puVar16 + (uVar10 & 0xffffffff) + 1;
  iVar23 = 0;
  bVar12 = 0;
  do {
    bVar5 = *pbVar17;
    iVar23 = iVar23 + ((bVar5 & 0x7f) << (bVar12 & 0x1f));
    bVar12 = bVar12 + 7;
    pbVar17 = pbVar17 + 1;
  } while ((char)bVar5 < '\0');
  MCInst_setOpcode(MI,uVar15);
  if (0x45 < iVar23 - 1U) {
    uVar10 = (ulong)(uVar21 & 0x3fffff | uVar8 | local_48);
    goto LAB_001a4dc5;
  }
  Decoder = (void *)((long)&switchD_001a433e::switchdataD_00249dc8 +
                    (long)(int)(&switchD_001a433e::switchdataD_00249dc8)[iVar23 - 1U]);
  switch(iVar23) {
  case 1:
    uVar21 = uVar21 & 0x7ffff;
    goto LAB_001a4741;
  case 2:
    uVar21 = uVar21 & 0x3fffff;
LAB_001a4741:
    local_48 = uVar21 | uVar8 | local_48;
LAB_001a474b:
    MCOperand_CreateImm0(MI,(ulong)local_48);
    uVar10 = (ulong)(bVar1 >> 1 & 0xf);
    break;
  case 3:
    MCOperand_CreateReg0(MI,*(uint *)((long)IntRegDecoderTable + (ulong)(uVar22 >> 0xc & 0x7c)));
    uVar10 = (ulong)((bVar2 & 0x30) << 10 | uVar8 & 0x3fff | local_48);
    break;
  case 4:
    goto switchD_001a433e_caseD_4;
  case 5:
    MCOperand_CreateReg0(MI,*(uint *)((long)IntRegDecoderTable + (ulong)(bVar1 & 0x3e) * 2));
    local_48 = uVar21 & 0x3fffff | uVar8 | local_48;
    goto LAB_001a48c8;
  case 6:
    MCOperand_CreateImm0(MI,(ulong)(uVar21 & 0x7ffff | uVar8 | local_48));
    MCOperand_CreateImm0(MI,(ulong)(bVar1 >> 1 & 0xf));
    uVar21 = *(uint *)((long)FCCRegDecoderTable + (ulong)(bVar2 >> 2 & 0xc));
    goto LAB_001a4cee;
  case 7:
    uVar10 = (ulong)(uVar14 << 2);
    break;
  default:
    uVar10 = (ulong)(bVar1 & 0x3e);
    puVar11 = IntRegDecoderTable;
    goto LAB_001a4c88;
  case 9:
    MCOperand_CreateReg0(MI,*(uint *)((long)IntRegDecoderTable + (ulong)(bVar1 & 0x3e) * 2));
    MCOperand_CreateReg0(MI,*(uint *)((long)IntRegDecoderTable + (ulong)(uVar22 >> 0xc & 0x7c)));
    uVar10 = (ulong)(uint)((int)(uVar14 << 0x13) >> 0x13);
    break;
  case 0xb:
    MCOperand_CreateReg0(MI,*(uint *)((long)IntRegDecoderTable + (ulong)(bVar1 & 0x3e) * 2));
    MCOperand_CreateReg0(MI,*(uint *)((long)IntRegDecoderTable + (ulong)(uVar22 >> 0xc & 0x7c)));
    uVar10 = (ulong)(uVar8 & 0x1fff | local_48);
    break;
  case 0xc:
    puVar11 = IntRegDecoderTable;
    uVar21 = *(uint *)((long)IntRegDecoderTable + (ulong)(uVar22 >> 0xc & 0x7c));
    goto LAB_001a4ca3;
  case 0xd:
    MCOperand_CreateReg0(MI,*(uint *)((long)IntRegDecoderTable + (ulong)(uVar22 >> 0xc & 0x7c)));
    local_48 = (int)(uVar14 << 0x13) >> 0x13;
LAB_001a48c8:
    uVar10 = (ulong)local_48;
    break;
  case 0xf:
    MCOperand_CreateReg0(MI,*(uint *)((long)IntRegDecoderTable + (ulong)(bVar1 & 0x3e) * 2));
    MCOperand_CreateReg0(MI,*(uint *)((long)IntRegDecoderTable + (ulong)(uVar22 >> 0xc & 0x7c)));
    uVar21 = bVar4 & 0x3f;
    goto LAB_001a4acf;
  case 0x10:
    uVar10 = (ulong)(uint)((int)(uVar14 << 0x13) >> 0x13);
    break;
  case 0x11:
    uVar10 = (ulong)(bVar1 & 0x3e);
    puVar11 = IntRegDecoderTable;
    goto LAB_001a4a1a;
  case 0x12:
    uVar10 = (ulong)(bVar1 & 0x3e);
    puVar11 = IntRegDecoderTable;
    goto LAB_001a4c1a;
  case 0x13:
    uVar21 = *(uint *)((long)IntRegDecoderTable + (ulong)(bVar1 & 0x3e) * 2);
    uVar14 = uVar21;
    goto LAB_001a4a63;
  case 0x14:
    uVar21 = *(uint *)((long)IntRegDecoderTable + (ulong)(bVar1 & 0x3e) * 2);
    MCOperand_CreateReg0(MI,uVar21);
    uVar14 = *(uint *)((long)FCCRegDecoderTable + (ulong)(bVar3 >> 1 & 0xc));
LAB_001a4a63:
    MCOperand_CreateReg0(MI,uVar14);
    MCOperand_CreateImm0(MI,(ulong)(uVar8 & 0x7ff | local_48));
LAB_001a4a79:
    MCOperand_CreateReg0(MI,uVar21);
    uVar10 = (ulong)(uVar22 >> 0xe & 0xf);
    break;
  case 0x15:
  case 0x2f:
    uVar10 = (ulong)(bVar1 & 0x3e);
    puVar11 = IntRegDecoderTable;
    goto LAB_001a4b87;
  case 0x16:
    MCOperand_CreateReg0(MI,*(uint *)((long)IntRegDecoderTable + (ulong)(bVar1 & 0x3e) * 2));
    MCOperand_CreateReg0(MI,*(uint *)((long)IntRegDecoderTable + (ulong)(uVar22 >> 0xc & 0x7c)));
    uVar10 = (ulong)(uVar8 & 0x3ff | local_48);
    break;
  case 0x17:
    uVar10 = (ulong)(bVar1 & 0x3e);
    puVar11 = FPRegDecoderTable;
    goto LAB_001a4b87;
  case 0x18:
    uVar10 = (ulong)(bVar1 & 0x3e);
    puVar11 = DFPRegDecoderTable;
LAB_001a4b87:
    uVar21 = *(uint *)((long)puVar11 + uVar10 * 2);
    goto LAB_001a4ca3;
  case 0x19:
    uVar21 = bVar1 >> 1 & 0x1f;
    if ((0xccccccccU >> uVar21 & 1) != 0) {
      return false;
    }
    uVar21 = QFPRegDecoderTable[uVar21];
    goto LAB_001a4d64;
  case 0x1a:
    uVar10 = (ulong)(bVar1 & 0x3e);
    puVar11 = FPRegDecoderTable;
    goto LAB_001a4c88;
  case 0x1b:
    uVar10 = (ulong)(bVar1 & 0x3e);
    puVar11 = DFPRegDecoderTable;
LAB_001a4c88:
    MCOperand_CreateReg0(MI,*(uint *)((long)puVar11 + uVar10 * 2));
    uVar10 = (ulong)(uVar22 >> 0xc & 0x7c);
LAB_001a4c9f:
    uVar21 = *(uint *)(uVar10 + (long)puVar11);
LAB_001a4ca3:
    MCOperand_CreateReg0(MI,uVar21);
    uVar21 = puVar11[bVar4 & 0x1f];
    goto LAB_001a4cee;
  case 0x1c:
    uVar21 = bVar1 >> 1 & 0x1f;
    if ((0xccccccccU >> uVar21 & 1) != 0) {
      return false;
    }
    MCOperand_CreateReg0(MI,QFPRegDecoderTable[uVar21]);
    goto joined_r0x001a4d53;
  case 0x1d:
    uVar21 = *(uint *)((long)DFPRegDecoderTable + (ulong)(bVar1 & 0x3e) * 2);
    goto LAB_001a4beb;
  case 0x1e:
    uVar21 = bVar1 >> 1 & 0x1f;
    if ((0xccccccccU >> uVar21 & 1) != 0) {
      return false;
    }
    puVar11 = QFPRegDecoderTable;
    goto LAB_001a49a8;
  case 0x1f:
    uVar21 = *(uint *)((long)DFPRegDecoderTable + (ulong)(bVar1 & 0x3e) * 2);
    goto LAB_001a4774;
  case 0x20:
    puVar11 = DFPRegDecoderTable;
    goto LAB_001a495d;
  case 0x21:
    puVar11 = FPRegDecoderTable;
    goto LAB_001a4568;
  case 0x22:
    uVar21 = bVar1 >> 1 & 0x1f;
    if ((0xccccccccU >> uVar21 & 1) != 0) {
      return false;
    }
    uVar21 = QFPRegDecoderTable[uVar21];
    goto LAB_001a456b;
  case 0x23:
    puVar11 = FPRegDecoderTable;
LAB_001a495d:
    MCOperand_CreateReg0(MI,*(uint *)((long)puVar11 + (ulong)(bVar1 & 0x3e) * 2));
    if ((0xccccccccU >> (bVar4 & 0x1f) & 1) != 0) {
      return false;
    }
    uVar10 = (ulong)(bVar4 & 0x1f);
    puVar11 = QFPRegDecoderTable;
    goto LAB_001a4ce8;
  case 0x24:
    uVar21 = bVar1 >> 1 & 0x1f;
    if ((0xccccccccU >> uVar21 & 1) != 0) {
      return false;
    }
    uVar21 = QFPRegDecoderTable[uVar21];
LAB_001a4774:
    MCOperand_CreateReg0(MI,uVar21);
    uVar10 = (ulong)(bVar4 & 0x1f);
    puVar11 = FPRegDecoderTable;
LAB_001a4ce8:
    uVar21 = puVar11[uVar10];
    goto LAB_001a4cee;
  case 0x25:
    uVar10 = (ulong)(bVar1 & 0x3e);
    puVar11 = FPRegDecoderTable;
    goto LAB_001a4a1a;
  case 0x26:
    uVar10 = (ulong)(bVar1 & 0x3e);
    puVar11 = FPRegDecoderTable;
    goto LAB_001a4c1a;
  case 0x27:
    uVar10 = (ulong)(bVar1 & 0x3e);
    puVar11 = DFPRegDecoderTable;
LAB_001a4a1a:
    uVar21 = *(uint *)((long)puVar11 + uVar10 * 2);
    uVar8 = uVar21;
LAB_001a4c43:
    MCOperand_CreateReg0(MI,uVar8);
    MCOperand_CreateReg0(MI,puVar11[bVar4 & 0x1f]);
    MCOperand_CreateReg0(MI,uVar21);
    uVar10 = (ulong)(uVar22 >> 0xe & 0xf);
    break;
  case 0x28:
    uVar10 = (ulong)(bVar1 & 0x3e);
    puVar11 = DFPRegDecoderTable;
LAB_001a4c1a:
    uVar21 = *(uint *)((long)puVar11 + uVar10 * 2);
    MCOperand_CreateReg0(MI,uVar21);
    uVar8 = *(uint *)((long)FCCRegDecoderTable + (ulong)(bVar3 >> 1 & 0xc));
    goto LAB_001a4c43;
  case 0x29:
    uVar21 = bVar1 >> 1 & 0x1f;
    if ((0xccccccccU >> uVar21 & 1) != 0) {
      return false;
    }
    uVar21 = QFPRegDecoderTable[uVar21];
    MCOperand_CreateReg0(MI,uVar21);
    if ((0xccccccccU >> (bVar4 & 0x1f) & 1) != 0) {
      return false;
    }
    MCOperand_CreateReg0(MI,QFPRegDecoderTable[bVar4 & 0x1f]);
    MCOperand_CreateReg0(MI,uVar21);
    uVar10 = (ulong)(uVar22 >> 0xe & 0xf);
    break;
  case 0x2a:
    uVar21 = bVar1 >> 1 & 0x1f;
    if ((0xccccccccU >> uVar21 & 1) != 0) {
      return false;
    }
    uVar21 = QFPRegDecoderTable[uVar21];
    MCOperand_CreateReg0(MI,uVar21);
    MCOperand_CreateReg0(MI,*(uint *)((long)FCCRegDecoderTable + (ulong)(bVar3 >> 1 & 0xc)));
    if ((0xccccccccU >> (bVar4 & 0x1f) & 1) != 0) {
      return false;
    }
    MCOperand_CreateReg0(MI,QFPRegDecoderTable[bVar4 & 0x1f]);
    goto LAB_001a4a79;
  case 0x2b:
    puVar11 = FPRegDecoderTable;
    MCOperand_CreateReg0(MI,*(uint *)((long)FPRegDecoderTable + (ulong)(bVar1 & 0x3e) * 2));
    uVar21 = *(uint *)((long)IntRegDecoderTable + (ulong)(uVar22 >> 0xc & 0x7c));
    goto LAB_001a4ca3;
  case 0x2c:
    uVar21 = bVar1 >> 1 & 0x1f;
    if (3 < uVar21) {
      return false;
    }
    uVar21 = FCCRegDecoderTable[uVar21];
LAB_001a4beb:
    MCOperand_CreateReg0(MI,uVar21);
    uVar10 = (ulong)(uVar22 >> 0xc & 0x7c);
    puVar11 = FPRegDecoderTable;
    goto LAB_001a4c9f;
  case 0x2d:
    uVar21 = bVar1 >> 1 & 0x1f;
    if (3 < uVar21) {
      return false;
    }
    puVar11 = FCCRegDecoderTable;
LAB_001a49a8:
    uVar21 = puVar11[uVar21];
LAB_001a49ab:
    MCOperand_CreateReg0(MI,uVar21);
    uVar10 = (ulong)(uVar22 >> 0xc & 0x7c);
    puVar11 = DFPRegDecoderTable;
    goto LAB_001a4c9f;
  case 0x2e:
    uVar21 = bVar1 >> 1 & 0x1f;
    if (3 < uVar21) {
      return false;
    }
    MCOperand_CreateReg0(MI,FCCRegDecoderTable[uVar21]);
joined_r0x001a4d53:
    uVar21 = uVar22 >> 0xe & 0x1f;
    if ((0xccccccccU >> uVar21 & 1) != 0) {
      return false;
    }
    uVar21 = QFPRegDecoderTable[uVar21];
LAB_001a4d64:
    MCOperand_CreateReg0(MI,uVar21);
    if ((0xccccccccU >> (bVar4 & 0x1f) & 1) != 0) {
      return false;
    }
    uVar21 = QFPRegDecoderTable[bVar4 & 0x1f];
    goto LAB_001a4cee;
  case 0x30:
    uVar21 = IntRegDecoderTable[bVar4 & 0x1f];
    goto LAB_001a4cee;
  case 0x31:
    uVar21 = *(uint *)((long)IntRegDecoderTable + (ulong)(bVar1 & 0x3e) * 2);
    goto LAB_001a49ab;
  case 0x32:
    puVar11 = DFPRegDecoderTable;
    goto LAB_001a4642;
  case 0x33:
    puVar11 = FPRegDecoderTable;
LAB_001a4642:
    uVar21 = *(uint *)((long)puVar11 + (ulong)(bVar1 & 0x3e) * 2);
    MCOperand_CreateReg0(MI,uVar21);
    goto LAB_001a4cee;
  case 0x34:
    puVar11 = DFPRegDecoderTable;
    goto LAB_001a4d98;
  case 0x35:
    puVar11 = FPRegDecoderTable;
LAB_001a4d98:
    MCOperand_CreateReg0(MI,*(uint *)((long)puVar11 + (ulong)(bVar1 & 0x3e) * 2));
    uVar21 = *(uint *)((ulong)(uVar22 >> 0xc & 0x7c) + (long)puVar11);
    goto LAB_001a4cee;
  case 0x36:
    puVar11 = IntRegDecoderTable;
LAB_001a4568:
    uVar21 = *(uint *)((long)puVar11 + (ulong)(bVar1 & 0x3e) * 2);
LAB_001a456b:
    MCOperand_CreateReg0(MI,uVar21);
    uVar10 = (ulong)(bVar4 & 0x1f);
    puVar11 = DFPRegDecoderTable;
    goto LAB_001a4ce8;
  case 0x37:
    MCOperand_CreateReg0(MI,*(uint *)((long)DFPRegDecoderTable + (ulong)(bVar1 & 0x3e) * 2));
    uVar10 = (ulong)(bVar4 & 0x1f);
    puVar11 = IntRegDecoderTable;
    goto LAB_001a4ce8;
  case 0x38:
    DVar9 = DecodeJMPL(MI,uVar14,Address,Decoder);
    goto LAB_001a4b6b;
  case 0x39:
    DVar9 = DecodeReturn(MI,uVar14,Address,Decoder);
    goto LAB_001a4b6b;
  case 0x3a:
    MCOperand_CreateReg0(MI,*(uint *)((long)IntRegDecoderTable + (ulong)(uVar22 >> 0xc & 0x7c)));
    MCOperand_CreateReg0(MI,IntRegDecoderTable[bVar4 & 0x1f]);
    uVar21 = bVar1 >> 1 & 0xf;
LAB_001a4acf:
    uVar10 = (ulong)uVar21;
    break;
  case 0x3b:
    MCOperand_CreateReg0(MI,*(uint *)((long)IntRegDecoderTable + (ulong)(uVar22 >> 0xc & 0x7c)));
    local_48 = (uint)bVar4;
    goto LAB_001a474b;
  case 0x3c:
    pcVar18 = DecodeIntRegsRegisterClass;
    goto LAB_001a4b52;
  case 0x3d:
    pcVar18 = DecodeIntRegsRegisterClass;
    goto LAB_001a487d;
  case 0x3e:
    DVar9 = DecodeSWAP(MI,uVar14,Address,Decoder);
    goto LAB_001a4b6b;
  case 0x3f:
    pcVar18 = DecodeFPRegsRegisterClass;
    goto LAB_001a4b52;
  case 0x40:
    pcVar18 = DecodeQFPRegsRegisterClass;
    goto LAB_001a4b52;
  case 0x41:
    pcVar18 = DecodeDFPRegsRegisterClass;
LAB_001a4b52:
    DVar9 = DecodeMem(MI,uVar14,address,info,true,pcVar18);
LAB_001a4b6b:
    if (DVar9 == MCDisassembler_Fail) {
      return false;
    }
    goto switchD_001a433e_caseD_4;
  case 0x42:
    pcVar18 = DecodeFPRegsRegisterClass;
    goto LAB_001a487d;
  case 0x43:
    pcVar18 = DecodeQFPRegsRegisterClass;
    goto LAB_001a487d;
  case 0x44:
    pcVar18 = DecodeDFPRegsRegisterClass;
LAB_001a487d:
    DVar9 = DecodeMem(MI,uVar14,address,info,false,pcVar18);
    if (DVar9 == MCDisassembler_Fail) {
      return false;
    }
    goto switchD_001a433e_caseD_4;
  case 0x45:
  case 0x46:
    uVar21 = *(uint *)((long)IntRegDecoderTable + (ulong)(bVar1 & 0x3e) * 2);
    MCOperand_CreateReg0(MI,uVar21);
    MCOperand_CreateReg0(MI,*(uint *)((long)IntRegDecoderTable + (ulong)(uVar22 >> 0xc & 0x7c)));
    MCOperand_CreateReg0(MI,IntRegDecoderTable[bVar4 & 0x1f]);
LAB_001a4cee:
    MCOperand_CreateReg0(MI,uVar21);
    goto switchD_001a433e_caseD_4;
  }
LAB_001a4dc5:
  MCOperand_CreateImm0(MI,uVar10);
switchD_001a433e_caseD_4:
  *size = 4;
  return true;
}

Assistant:

static DecodeStatus readInstruction32(const uint8_t *code, size_t len, uint32_t *Insn)
{
	uint8_t Bytes[4];

	if (len < 4)
		// not enough data
		return MCDisassembler_Fail;

	memcpy(Bytes, code, 4);

	// Encoded as a big-endian 32-bit word in the stream.
	*Insn = (Bytes[3] <<  0) |
		(Bytes[2] <<  8) |
		(Bytes[1] << 16) |
		(Bytes[0] << 24);

	return MCDisassembler_Success;
}